

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::time_offset(spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  sequence *in_RDI;
  undefined7 in_stack_fffffffffffffeb8;
  char_type in_stack_fffffffffffffebf;
  digit *in_stack_fffffffffffffec0;
  character_either *this;
  character_either *args;
  scanner_base in_stack_fffffffffffffee0;
  character_either *in_stack_fffffffffffffee8;
  sequence *in_stack_fffffffffffffef0;
  character_either local_d0;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 *local_40;
  undefined8 local_38;
  
  local_42 = 0x5a;
  local_41 = 0x7a;
  local_40 = &local_42;
  local_38 = 2;
  cs._M_len = (size_type)in_stack_fffffffffffffef0;
  cs._M_array = (iterator)in_stack_fffffffffffffee8;
  character_either::character_either
            ((character_either *)in_stack_fffffffffffffee0._vptr_scanner_base,cs);
  local_9a = 0x2b;
  local_99 = 0x2d;
  local_98 = &local_9a;
  local_90 = 2;
  cs_00._M_len = (size_type)in_stack_fffffffffffffef0;
  cs_00._M_array = (iterator)in_stack_fffffffffffffee8;
  character_either::character_either
            ((character_either *)in_stack_fffffffffffffee0._vptr_scanner_base,cs_00);
  args = &local_d0;
  digit::digit(in_stack_fffffffffffffec0,
               (spec *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            ((repeat_exact *)in_stack_fffffffffffffee0._vptr_scanner_base,(size_t)args,
             (digit *)in_RDI);
  character::character((character *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
  this = (character_either *)&stack0xfffffffffffffee0;
  digit::digit((digit *)this,(spec *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            ((repeat_exact *)in_stack_fffffffffffffee0._vptr_scanner_base,(size_t)args,
             (digit *)in_RDI);
  sequence::
  sequence<toml::detail::character_either,toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (repeat_exact *)in_stack_fffffffffffffee0._vptr_scanner_base,(character *)args,
             (repeat_exact *)in_RDI);
  either::either<toml::detail::character_either,toml::detail::sequence>
            ((either *)in_stack_fffffffffffffee0._vptr_scanner_base,args,in_RDI);
  sequence::~sequence((sequence *)this);
  repeat_exact::~repeat_exact((repeat_exact *)this);
  digit::~digit((digit *)this);
  character::~character((character *)0x673142);
  repeat_exact::~repeat_exact((repeat_exact *)this);
  digit::~digit((digit *)this);
  character_either::~character_either(this);
  character_either::~character_either(this);
  return (either *)in_RDI;
}

Assistant:

TOML11_INLINE either time_offset(const spec& s)
{
    return either(
            character_either{'Z', 'z'},
            sequence(character_either{'+', '-'},
                     repeat_exact(2, digit(s)),
                     character(':'),
                     repeat_exact(2, digit(s))
             )
        );
}